

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-client.c
# Opt level: O3

int callback_dumb_increment(lws *wsi,lws_callback_reasons reason,void *user,void *in,size_t len)

{
  char cVar1;
  long lVar2;
  char cVar3;
  uint uVar4;
  int iVar5;
  size_t len_00;
  X509_VERIFY_PARAM *param;
  X509_STORE *v;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  ulong uVar6;
  char *pcVar7;
  char *pcVar8;
  lws **pplVar9;
  uchar **p;
  int lenx;
  char *px;
  lws_tls_cert_info_results ci;
  int local_454;
  char *local_450;
  lws_tls_cert_info_results local_448 [14];
  
  if ((int)reason < 0x1a) {
    switch(reason) {
    case LWS_CALLBACK_CLIENT_CONNECTION_ERROR:
      if (wsi_dumb == wsi) {
        wsi_dumb = (lws *)0x0;
        pcVar7 = "dumb";
      }
      else {
        pcVar7 = "http";
      }
      if (wsi_mirror == wsi) {
        wsi_mirror = (lws *)0x0;
        pcVar7 = "mirror";
      }
      pplVar9 = wsi_multi;
      uVar6 = 0;
      do {
        if (*pplVar9 == wsi) {
          sprintf((char *)&local_448[0].time,"multi %d",uVar6 & 0xffffffff);
          *pplVar9 = (lws *)0x0;
          pcVar7 = (char *)local_448;
        }
        uVar6 = uVar6 + 1;
        pplVar9 = pplVar9 + 1;
      } while (uVar6 != 3);
      pcVar8 = "(null)";
      if (in != (void *)0x0) {
        pcVar8 = (char *)in;
      }
      _lws_log(1,"CLIENT_CONNECTION_ERROR: %s: %s\n",pcVar7,pcVar8);
      break;
    case LWS_CALLBACK_CLIENT_FILTER_PRE_ESTABLISH:
    case LWS_CALLBACK_CLOSED_HTTP:
    case LWS_CALLBACK_RECEIVE:
    case LWS_CALLBACK_RECEIVE_PONG:
    case LWS_CALLBACK_CLIENT_RECEIVE_PONG:
      break;
    case LWS_CALLBACK_CLIENT_ESTABLISHED:
      _lws_log(8,"dumb: LWS_CALLBACK_CLIENT_ESTABLISHED\n");
      break;
    case LWS_CALLBACK_CLOSED:
      _lws_log(4,"dumb: LWS_CALLBACK_CLOSED\n");
      wsi_dumb = (lws *)0x0;
      break;
    case LWS_CALLBACK_CLIENT_RECEIVE:
      *(undefined1 *)((long)in + len) = 0;
      _lws_log(8,"rx %d \'%s\'\n",len & 0xffffffff,in);
      break;
    case LWS_CALLBACK_CLIENT_WRITEABLE:
      _lws_log(8,"Client wsi %p writable\n",wsi);
      break;
    default:
      if (reason == LWS_CALLBACK_OPENSSL_LOAD_EXTRA_CLIENT_VERIFY_CERTS) {
        if (crl_path[0] != '\0') {
          param = X509_VERIFY_PARAM_new();
          X509_VERIFY_PARAM_set_flags(param,4);
          SSL_CTX_set1_param((SSL_CTX *)user,param);
          v = SSL_CTX_get_cert_store((SSL_CTX *)user);
          m = X509_LOOKUP_file();
          ctx = X509_STORE_add_lookup(v,m);
          iVar5 = X509_load_cert_crl_file(ctx,crl_path,1);
          X509_VERIFY_PARAM_free(param);
          if (iVar5 != 1) {
            uVar6 = ERR_get_error();
            pcVar7 = ERR_error_string((long)(int)uVar6,(char *)&local_448[0].time);
            _lws_log(1,"EXTRA_CLIENT_VERIFY_CERTS: SSL error: %s (%d)\n",pcVar7,uVar6 & 0xffffffff);
            return 1;
          }
        }
      }
      else if ((reason == LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER) && (test_post == '\x01')) {
        lVar2 = *in;
        iVar5 = lws_add_http_header_by_token
                          (wsi,WSI_TOKEN_HTTP_CONTENT_LENGTH,(uchar *)"29",2,(uchar **)in,
                           (uchar *)(len + lVar2));
        if (iVar5 != 0) {
          return -1;
        }
        iVar5 = lws_add_http_header_by_token
                          (wsi,WSI_TOKEN_HTTP_CONTENT_TYPE,
                           (uchar *)"application/x-www-form-urlencoded",0x21,(uchar **)in,
                           (uchar *)(len + lVar2));
        if (iVar5 != 0) {
          return -1;
        }
        lws_client_http_body_pending(wsi,1);
        lws_callback_on_writable(wsi);
      }
    }
  }
  else {
    switch(reason) {
    case LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP:
      uVar4 = lws_http_client_http_response(wsi);
      _lws_log(4,"lws_http_client_http_response %d\n",(ulong)uVar4);
      iVar5 = lws_tls_peer_cert_info(wsi,LWS_TLS_CERT_INFO_COMMON_NAME,local_448,0x40);
      if (iVar5 == 0) {
        _lws_log(4," Peer Cert CN        : %s\n",local_448[0].ns.name);
      }
      iVar5 = lws_tls_peer_cert_info(wsi,LWS_TLS_CERT_INFO_ISSUER_NAME,local_448,0x40);
      if (iVar5 == 0) {
        _lws_log(4," Peer Cert issuer    : %s\n",local_448[0].ns.name);
      }
      iVar5 = lws_tls_peer_cert_info(wsi,LWS_TLS_CERT_INFO_VALIDITY_FROM,local_448,0);
      if (iVar5 == 0) {
        pcVar7 = ctime(&local_448[0].time);
        _lws_log(4," Peer Cert Valid from: %s",pcVar7);
      }
      iVar5 = lws_tls_peer_cert_info(wsi,LWS_TLS_CERT_INFO_VALIDITY_TO,local_448,0);
      if (iVar5 == 0) {
        pcVar7 = ctime(&local_448[0].time);
        _lws_log(4," Peer Cert Valid to  : %s",pcVar7);
      }
      iVar5 = lws_tls_peer_cert_info(wsi,LWS_TLS_CERT_INFO_USAGE,local_448,0);
      if (iVar5 == 0) {
        _lws_log(4," Peer Cert usage bits: 0x%x\n",(ulong)(uint)local_448[0]._0_4_);
      }
      break;
    case LWS_CALLBACK_CLOSED_CLIENT_HTTP:
      break;
    case LWS_CALLBACK_RECEIVE_CLIENT_HTTP:
      local_450 = local_448[0].ns.name + 0xc;
      local_454 = 0x400;
      iVar5 = lws_http_client_read(wsi,&local_450,&local_454);
      if (iVar5 < 0) {
        return -1;
      }
      break;
    case LWS_CALLBACK_COMPLETED_CLIENT_HTTP:
      wsi_dumb = (lws *)0x0;
      force_exit = 1;
      break;
    case LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ:
      _lws_log(4,"LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ: %ld\n",len);
      iVar5 = lwsl_visible(8);
      if ((len != 0) && (iVar5 != 0)) {
        do {
          cVar1 = *in;
          cVar3 = cVar1;
          if (cVar1 == '\x7f') {
            cVar3 = '.';
          }
          in = (void *)((long)in + (ulong)(cVar1 != '\x7f'));
          putchar((int)cVar3);
          len = len - 1;
        } while (len != 0);
      }
      break;
    default:
      if (reason == LWS_CALLBACK_CLIENT_CONFIRM_EXTENSION_SUPPORTED) {
        iVar5 = strcmp((char *)in,"deflate-stream");
        if ((iVar5 == 0) && ((deny_deflate & 1) != 0)) {
          _lws_log(4,"denied deflate-stream extension\n");
          return 1;
        }
        iVar5 = strcmp((char *)in,"x-webkit-deflate-frame");
        if (iVar5 == 0) {
          return 1;
        }
        iVar5 = strcmp((char *)in,"deflate-frame");
        if (iVar5 == 0) {
          return 1;
        }
      }
      else if (reason == LWS_CALLBACK_CLIENT_HTTP_WRITEABLE) {
        local_448[0]._32_6_ = 0x742b646e6553;
        local_448[0]._38_1_ = 'h';
        local_448[0]._39_1_ = 'e';
        local_448[0]._40_1_ = '+';
        local_448[0]._41_1_ = 'f';
        local_448[0]._42_1_ = 'o';
        local_448[0]._43_1_ = 'r';
        local_448[0]._44_1_ = 'm';
        local_448[0]._45_1_ = '\0';
        local_448[0]._16_1_ = 't';
        local_448[0]._17_1_ = 'e';
        local_448[0]._18_1_ = 'x';
        local_448[0]._19_1_ = 't';
        local_448[0]._20_1_ = '=';
        local_448[0]._21_1_ = 'h';
        local_448[0]._22_1_ = 'e';
        local_448[0]._23_1_ = 'l';
        local_448[0]._24_6_ = 0x6e6573266f6c;
        local_448[0]._30_2_ = 0x3d64;
        len_00 = strlen(local_448[0].ns.name + 0xc);
        iVar5 = lws_write(wsi,(uchar *)(local_448[0].ns.name + 0xc),len_00,LWS_WRITE_HTTP);
        if (iVar5 < 0) {
          return -1;
        }
        lws_client_http_body_pending(wsi,0);
      }
    }
  }
  return 0;
}

Assistant:

static int
callback_dumb_increment(struct lws *wsi, enum lws_callback_reasons reason,
			void *user, void *in, size_t len)
{
#if defined(LWS_WITH_TLS)
	union lws_tls_cert_info_results ci;
#endif
	const char *which = "http";
	char which_wsi[10], buf[50 + LWS_PRE];
	int n;

	switch (reason) {

	case LWS_CALLBACK_CLIENT_ESTABLISHED:
		lwsl_info("dumb: LWS_CALLBACK_CLIENT_ESTABLISHED\n");
		break;

	case LWS_CALLBACK_CLOSED:
		lwsl_notice("dumb: LWS_CALLBACK_CLOSED\n");
		wsi_dumb = NULL;
		break;

	case LWS_CALLBACK_CLIENT_RECEIVE:
		((char *)in)[len] = '\0';
		lwsl_info("rx %d '%s'\n", (int)len, (char *)in);
		break;

	/* because we are protocols[0] ... */

	case LWS_CALLBACK_CLIENT_CONNECTION_ERROR:
		if (wsi == wsi_dumb) {
			which = "dumb";
			wsi_dumb = NULL;
		}
		if (wsi == wsi_mirror) {
			which = "mirror";
			wsi_mirror = NULL;
		}

		for (n = 0; n < (int)LWS_ARRAY_SIZE(wsi_multi); n++)
			if (wsi == wsi_multi[n]) {
				sprintf(which_wsi, "multi %d", n);
				which = which_wsi;
				wsi_multi[n] = NULL;
			}

		lwsl_err("CLIENT_CONNECTION_ERROR: %s: %s\n", which,
			 in ? (char *)in : "(null)");
		break;

	case LWS_CALLBACK_CLIENT_CONFIRM_EXTENSION_SUPPORTED:
		if ((strcmp((const char *)in, "deflate-stream") == 0) &&
		    deny_deflate) {
			lwsl_notice("denied deflate-stream extension\n");
			return 1;
		}
		if ((strcmp((const char *)in, "x-webkit-deflate-frame") == 0))
			return 1;
		if ((strcmp((const char *)in, "deflate-frame") == 0))
			return 1;
		break;

	case LWS_CALLBACK_ESTABLISHED_CLIENT_HTTP:
		lwsl_notice("lws_http_client_http_response %d\n",
				lws_http_client_http_response(wsi));
#if defined(LWS_WITH_TLS)
		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_COMMON_NAME,
					    &ci, sizeof(ci.ns.name)))
			lwsl_notice(" Peer Cert CN        : %s\n", ci.ns.name);

		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_ISSUER_NAME,
					    &ci, sizeof(ci.ns.name)))
			lwsl_notice(" Peer Cert issuer    : %s\n", ci.ns.name);

		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_VALIDITY_FROM,
					    &ci, 0))
			lwsl_notice(" Peer Cert Valid from: %s", ctime(&ci.time));

		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_VALIDITY_TO,
					    &ci, 0))
			lwsl_notice(" Peer Cert Valid to  : %s", ctime(&ci.time));
		if (!lws_tls_peer_cert_info(wsi, LWS_TLS_CERT_INFO_USAGE,
					    &ci, 0))
			lwsl_notice(" Peer Cert usage bits: 0x%x\n", ci.usage);
#endif
		break;

	/* chunked content */
	case LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ:
		lwsl_notice("LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ: %ld\n",
			    (long)len);
		show_http_content(in, len);
		break;

	/* unchunked content */
	case LWS_CALLBACK_RECEIVE_CLIENT_HTTP:
		{
			char buffer[1024 + LWS_PRE];
			char *px = buffer + LWS_PRE;
			int lenx = sizeof(buffer) - LWS_PRE;

			/*
			 * Often you need to flow control this by something
			 * else being writable.  In that case call the api
			 * to get a callback when writable here, and do the
			 * pending client read in the writeable callback of
			 * the output.
			 *
			 * In the case of chunked content, this will call back
			 * LWS_CALLBACK_RECEIVE_CLIENT_HTTP_READ once per
			 * chunk or partial chunk in the buffer, and report
			 * zero length back here.
			 */
			if (lws_http_client_read(wsi, &px, &lenx) < 0)
				return -1;
		}
		break;

	case LWS_CALLBACK_CLIENT_WRITEABLE:
		lwsl_info("Client wsi %p writable\n", wsi);
		break;

	case LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER:
		if (test_post) {
			unsigned char **p = (unsigned char **)in, *end = (*p) + len;

			if (lws_add_http_header_by_token(wsi,
					WSI_TOKEN_HTTP_CONTENT_LENGTH,
					(unsigned char *)"29", 2, p, end))
				return -1;
			if (lws_add_http_header_by_token(wsi,
					WSI_TOKEN_HTTP_CONTENT_TYPE,
					(unsigned char *)"application/x-www-form-urlencoded",
					33, p, end))
				return -1;

			/* inform lws we have http body to send */
			lws_client_http_body_pending(wsi, 1);
			lws_callback_on_writable(wsi);
		}
		break;

	case LWS_CALLBACK_CLIENT_HTTP_WRITEABLE:
		strcpy(buf + LWS_PRE, "text=hello&send=Send+the+form");
		n = lws_write(wsi, (unsigned char *)&buf[LWS_PRE],
			      strlen(&buf[LWS_PRE]), LWS_WRITE_HTTP);
		if (n < 0)
			return -1;
		/* we only had one thing to send, so inform lws we are done
		 * if we had more to send, call lws_callback_on_writable(wsi);
		 * and just return 0 from callback.  On having sent the last
		 * part, call the below api instead.*/
		lws_client_http_body_pending(wsi, 0);
		break;

	case LWS_CALLBACK_COMPLETED_CLIENT_HTTP:
		wsi_dumb = NULL;
		force_exit = 1;
		break;

#if defined(LWS_WITH_TLS) && defined(LWS_HAVE_SSL_CTX_set1_param) && \
	!defined(LWS_WITH_MBEDTLS)
	case LWS_CALLBACK_OPENSSL_LOAD_EXTRA_CLIENT_VERIFY_CERTS:
		if (crl_path[0]) {
			/* Enable CRL checking of the server certificate */
			X509_STORE *store;
			X509_LOOKUP *lookup;
			int n;
			X509_VERIFY_PARAM *param = X509_VERIFY_PARAM_new();
			X509_VERIFY_PARAM_set_flags(param, X509_V_FLAG_CRL_CHECK);
			SSL_CTX_set1_param((SSL_CTX*)user, param);
			store = SSL_CTX_get_cert_store((SSL_CTX*)user);
			lookup = X509_STORE_add_lookup(store,
							X509_LOOKUP_file());
			n = X509_load_cert_crl_file(lookup, crl_path,
							X509_FILETYPE_PEM);
			X509_VERIFY_PARAM_free(param);
			if (n != 1) {
				char errbuf[256];
				n = ERR_get_error();
				lwsl_err("EXTRA_CLIENT_VERIFY_CERTS: "
					 "SSL error: %s (%d)\n",
					 ERR_error_string(n, errbuf), n);
				return 1;
			}
		}
		break;
#endif

	default:
		break;
	}

	return 0;
}